

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

VisionFeaturePrint_Objects *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects>(Arena *arena)

{
  VisionFeaturePrint_Objects *this;
  
  if (arena == (Arena *)0x0) {
    this = (VisionFeaturePrint_Objects *)operator_new(0x30);
    CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::VisionFeaturePrint_Objects
              (this,(Arena *)0x0,false);
  }
  else {
    this = (VisionFeaturePrint_Objects *)
           AllocateAlignedWithHook
                     (arena,0x30,
                      (type_info *)
                      &CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::typeinfo);
    CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::VisionFeaturePrint_Objects
              (this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }